

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O0

void xLearn::write_data(string *filename,string *data)

{
  int i;
  FILE *file;
  FILE *in_stack_000000e0;
  char *in_stack_00000198;
  char *in_stack_000001a0;
  size_t in_stack_00000250;
  char *in_stack_00000258;
  FILE *in_stack_00000260;
  undefined4 local_1c;
  
  std::__cxx11::string::c_str();
  OpenFileOrDie(in_stack_000001a0,in_stack_00000198);
  for (local_1c = 0; local_1c < 100000; local_1c = local_1c + 1) {
    std::__cxx11::string::data();
    std::__cxx11::string::size();
    WriteDataToDisk(in_stack_00000260,in_stack_00000258,in_stack_00000250);
  }
  Close(in_stack_000000e0);
  return;
}

Assistant:

void write_data(const std::string& filename,
                const std::string& data) {
  FILE* file = OpenFileOrDie(filename.c_str(), "w");
  for (int i = 0; i < kNum_lines; ++i) {
    WriteDataToDisk(file, data.data(), data.size());
  }
  Close(file);
}